

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O2

void __thiscall p2t::Triangle::DebugPrint(Triangle *this)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<double>(this->points_[0]->x);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(this->points_[0]->y);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(this->points_[1]->x);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(this->points_[1]->y);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(this->points_[2]->x);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(this->points_[2]->y);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Triangle::DebugPrint()
{
  using namespace std;
  cout << points_[0]->x << "," << points_[0]->y << " ";
  cout << points_[1]->x << "," << points_[1]->y << " ";
  cout << points_[2]->x << "," << points_[2]->y << endl;
}